

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O1

void __thiscall QColumnView::setResizeGripsVisible(QColumnView *this,bool visible)

{
  long lVar1;
  Connection *pCVar2;
  Connection *pCVar3;
  long lVar4;
  long lVar5;
  QWidget *parent;
  void **ppvVar6;
  QWidget *widget;
  undefined4 *puVar7;
  long lVar8;
  Connection *this_00;
  long in_FS_OFFSET;
  QObject local_60 [8];
  code *local_58;
  ImplFn local_50;
  code *local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  if ((bool)*(char *)(lVar1 + 0x570) != visible) {
    *(bool *)(lVar1 + 0x570) = visible;
    pCVar2 = *(Connection **)(lVar1 + 0x590);
    pCVar3 = *(Connection **)(lVar1 + 0x598);
    this_00 = pCVar2;
    if (pCVar3 != pCVar2) {
      do {
        QMetaObject::Connection::~Connection(this_00);
        this_00 = this_00 + 1;
      } while (this_00 != pCVar3);
      *(Connection **)(lVar1 + 0x598) = pCVar2;
    }
    lVar4 = *(long *)(lVar1 + 0x550);
    if (lVar4 != 0) {
      lVar5 = *(long *)(lVar1 + 0x548);
      lVar8 = 0;
      do {
        parent = *(QWidget **)(lVar5 + lVar8);
        if (visible) {
          widget = (QWidget *)operator_new(0x28);
          QColumnViewGrip::QColumnViewGrip((QColumnViewGrip *)widget,parent);
          QAbstractScrollArea::setCornerWidget((QAbstractScrollArea *)parent,widget);
          local_48 = QColumnViewGrip::gripMoved;
          local_40 = 0;
          local_58 = QColumnViewPrivate::gripMoved;
          local_50 = (ImplFn)0x0;
          ppvVar6 = *(void ***)(lVar1 + 8);
          puVar7 = (undefined4 *)operator_new(0x20);
          *puVar7 = 1;
          *(code **)(puVar7 + 2) =
               QtPrivate::
               QPrivateSlotObject<void_(QColumnViewPrivate::*)(int),_QtPrivate::List<int>,_void>::
               impl;
          *(code **)(puVar7 + 4) = QColumnViewPrivate::gripMoved;
          *(undefined8 *)(puVar7 + 6) = 0;
          QObject::connectImpl
                    (local_60,(void **)widget,(QObject *)&local_48,ppvVar6,
                     (QSlotObjectBase *)&local_58,(ConnectionType)puVar7,(int *)0x0,
                     (QMetaObject *)0x0);
          std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>::
          emplace_back<QMetaObject::Connection>
                    ((vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_> *)
                     (lVar1 + 0x590),(Connection *)local_60);
          QMetaObject::Connection::~Connection((Connection *)local_60);
        }
        else {
          QAbstractScrollArea::cornerWidget((QAbstractScrollArea *)parent);
          QAbstractScrollArea::setCornerWidget((QAbstractScrollArea *)parent,(QWidget *)0x0);
          QObject::deleteLater();
        }
        lVar8 = lVar8 + 8;
      } while (lVar4 << 3 != lVar8);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QColumnView::setResizeGripsVisible(bool visible)
{
    Q_D(QColumnView);
    if (d->showResizeGrips == visible)
        return;
    d->showResizeGrips = visible;
    d->gripConnections.clear();
    for (QAbstractItemView *view : std::as_const(d->columns)) {
        if (visible) {
            QColumnViewGrip *grip = new QColumnViewGrip(view);
            view->setCornerWidget(grip);
            d->gripConnections.push_back(
                QObjectPrivate::connect(grip, &QColumnViewGrip::gripMoved,
                                        d, &QColumnViewPrivate::gripMoved)
            );
        } else {
            QWidget *widget = view->cornerWidget();
            view->setCornerWidget(nullptr);
            widget->deleteLater();
        }
    }
}